

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

shared_ptr<embree::Texture> __thiscall
embree::CoronaLoader::loadMap(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  byte bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  *this_00;
  CoronaLoader *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  CoronaLoader *in_RDI;
  shared_ptr<embree::Texture> sVar4;
  Ref<embree::XML> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *__range1;
  string name;
  runtime_error *e;
  FileName src;
  string mapClass;
  shared_ptr<embree::Texture> *texture;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  key_type *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  FileName *other;
  Ref<embree::XML> *in_stack_fffffffffffffde8;
  allocator *this_01;
  CoronaLoader *in_stack_fffffffffffffdf0;
  allocator *xml_00;
  CoronaLoader *this_02;
  string *in_stack_fffffffffffffe38;
  __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
  in_stack_fffffffffffffe40;
  string local_1b0 [56];
  FileName *in_stack_fffffffffffffe88;
  string local_140 [32];
  _Self local_120;
  string local_118 [32];
  _Self local_f8;
  allocator local_e9;
  string local_e8 [32];
  long *local_c8 [7];
  allocator local_89;
  string local_88 [32];
  string local_68 [24];
  Ref<embree::XML> *in_stack_ffffffffffffffb0;
  
  this_02 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  if (bVar1) {
    xml_00 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"class",xml_00);
    XML::parm((XML *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
              in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    bVar1 = std::operator==(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    if (bVar1) {
      this_01 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"image",this_01);
      XML::child((XML *)in_stack_fffffffffffffe40._M_current,in_stack_fffffffffffffe38);
      load<embree::FileName>(this_02,(Ref<embree::XML> *)xml_00);
      other = (FileName *)local_c8;
      if (local_c8[0] != (long *)0x0) {
        (**(code **)(*local_c8[0] + 0x18))();
      }
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffd78);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
           ::find(in_stack_fffffffffffffd78,(key_type *)0x4102ae);
      local_120._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
           ::end(in_stack_fffffffffffffd78);
      bVar2 = std::operator!=(&local_f8,&local_120);
      std::__cxx11::string::~string(local_118);
      if ((bVar2 & 1) == 0) {
        embree::FileName::operator+((FileName *)this_01,other);
        Texture::load(in_stack_fffffffffffffe88);
        embree::FileName::~FileName((FileName *)0x41052c);
      }
      else {
        this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                   *)(in_RSI + 0x80);
        embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffd78);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
        ::operator[](this_00,in_stack_fffffffffffffdb8);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffd80,
                   (shared_ptr<embree::Texture> *)in_stack_fffffffffffffd78);
        std::__cxx11::string::~string(local_140);
      }
      bVar1 = true;
      embree::FileName::~FileName((FileName *)0x41066c);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
      if (bVar1) {
        load<std::__cxx11::string>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        in_stack_fffffffffffffd80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                           *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffd80,
                   (shared_ptr<embree::Texture> *)in_stack_fffffffffffffd78);
        bVar1 = true;
        std::__cxx11::string::~string(local_1b0);
      }
      else {
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string(local_68);
    _Var3._M_pi = extraout_RDX;
    if (bVar1) goto LAB_004108ee;
  }
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::begin
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             in_stack_fffffffffffffd78);
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::end
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             in_stack_fffffffffffffd78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                             *)in_stack_fffffffffffffd78), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
    ::operator*((__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                 *)&stack0xfffffffffffffe40);
    loadMap(in_RDX,in_stack_ffffffffffffffb0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_02);
    _Var3._M_pi = extraout_RDX_00;
    if (bVar1) goto LAB_004108ee;
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x4108be);
    __gnu_cxx::
    __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
    ::operator++((__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                  *)&stack0xfffffffffffffe40);
  }
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x4108ee);
  _Var3._M_pi = extraout_RDX_01;
LAB_004108ee:
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<embree::Texture>)
         sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> CoronaLoader::loadMap(const Ref<XML>& xml) 
  {
    /* process map node */
    if (xml->name == "map")
    {
      std::string mapClass = xml->parm("class");

      /* load textures */
      if (mapClass == "Texture")
      {
        const FileName src = load<FileName>(xml->child("image"));
        
        /* load images only once */
        if (textureFileMap.find(src) != textureFileMap.end())
          return textureFileMap[src];
        
        try {
          return Texture::load(path+src);
        } catch (const std::runtime_error& e) {
          std::cerr << "failed to load " << path+src << ": " << e.what() << std::endl;
        }
      }
      else if (mapClass == "Reference") {
        const std::string name = load<std::string>(xml);
        return textureMap[name];
      }
    }

    /* recurse into every unknown node to find some texture */
    for (auto& child : xml->children) {
      std::shared_ptr<Texture> texture = loadMap(child);
      if (texture) return texture;
    }
    return std::shared_ptr<Texture>();
  }